

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page.c
# Opt level: O0

void mi_page_free_list_extend(mi_page_t *page,size_t bsize,size_t extend,mi_stats_t *stats)

{
  uint8_t *page_start;
  mi_page_t *pmVar1;
  mi_page_t *pmVar2;
  long in_RDX;
  size_t in_RSI;
  mi_page_t *in_RDI;
  mi_block_t *next;
  mi_block_t *block;
  mi_block_t *last;
  mi_block_t *start;
  void *page_area;
  mi_page_t *in_stack_ffffffffffffffb8;
  mi_page_t *page_00;
  
  page_start = mi_page_start(in_RDI);
  pmVar1 = (mi_page_t *)mi_page_block_at(in_RDI,page_start,in_RSI,(ulong)in_RDI->capacity);
  pmVar2 = (mi_page_t *)
           mi_page_block_at(in_RDI,page_start,in_RSI,((ulong)in_RDI->capacity + in_RDX) - 1);
  page_00 = pmVar1;
  while (page_00 <= pmVar2) {
    in_stack_ffffffffffffffb8 = (mi_page_t *)((long)page_00->padding + (in_RSI - 0x58));
    mi_block_set_next(page_00,(mi_block_t *)in_stack_ffffffffffffffb8,(mi_block_t *)0x14b89ef);
    page_00 = in_stack_ffffffffffffffb8;
  }
  mi_block_set_next(page_00,(mi_block_t *)in_stack_ffffffffffffffb8,(mi_block_t *)0x14b8a12);
  in_RDI->free = (mi_block_t *)pmVar1;
  return;
}

Assistant:

static mi_decl_noinline void mi_page_free_list_extend( mi_page_t* const page, const size_t bsize, const size_t extend, mi_stats_t* const stats)
{
  MI_UNUSED(stats);
  #if (MI_SECURE <= 2)
  mi_assert_internal(page->free == NULL);
  mi_assert_internal(page->local_free == NULL);
  #endif
  mi_assert_internal(page->capacity + extend <= page->reserved);
  mi_assert_internal(bsize == mi_page_block_size(page));
  void* const page_area = mi_page_start(page);

  mi_block_t* const start = mi_page_block_at(page, page_area, bsize, page->capacity);

  // initialize a sequential free list
  mi_block_t* const last = mi_page_block_at(page, page_area, bsize, page->capacity + extend - 1);
  mi_block_t* block = start;
  while(block <= last) {
    mi_block_t* next = (mi_block_t*)((uint8_t*)block + bsize);
    mi_block_set_next(page,block,next);
    block = next;
  }
  // prepend to free list (usually `NULL`)
  mi_block_set_next(page, last, page->free);
  page->free = start;
}